

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::BasicVariousTessLevelsPosAttrCase::
BasicVariousTessLevelsPosAttrCase
          (BasicVariousTessLevelsPosAttrCase *this,Context *context,char *name,char *description,
          TessPrimitiveType primitiveType,SpacingMode spacing,char *referenceImagePathPrefix)

{
  allocator<char> local_21;
  
  gles31::TestCase::TestCase(&this->super_TestCase,context,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BasicVariousTessLevelsPosAttrCase_01e50640;
  this->m_primitiveType = primitiveType;
  this->m_spacing = spacing;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_referenceImagePathPrefix,referenceImagePathPrefix,&local_21);
  (this->m_program).m_ptr = (ShaderProgram *)0x0;
  (this->m_program).m_state = (SharedPtrStateBase *)0x0;
  return;
}

Assistant:

BasicVariousTessLevelsPosAttrCase (Context&				context,
													   const char*			name,
													   const char*			description,
													   TessPrimitiveType	primitiveType,
													   SpacingMode			spacing,
													   const char*			referenceImagePathPrefix)
						: TestCase						(context, name, description)
						, m_primitiveType				(primitiveType)
						, m_spacing						(spacing)
						, m_referenceImagePathPrefix	(referenceImagePathPrefix)
					{
					}